

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::timestamp_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCastTZ>>
               (timestamp_t *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  ulong *puVar2;
  sel_t *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  undefined8 uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  idx_t idx_in_entry;
  ulong uVar10;
  char **ppcVar11;
  string_t sVar12;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = sel_vector->sel_vector;
      ppcVar11 = &(result_data->value).pointer.ptr;
      uVar10 = 0;
      do {
        uVar7 = uVar10;
        if (psVar3 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar3[uVar10];
        }
        sVar12 = StringCastTZ::Operation<duckdb::timestamp_t>
                           ((timestamp_t)ldata[uVar7].value,(Vector *)dataptr);
        uVar8 = sVar12.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
        paVar1->length = (int)uVar8;
        paVar1->prefix[0] = (char)((ulong)uVar8 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar8 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar8 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar8 >> 0x38);
        *ppcVar11 = sVar12.value._8_8_;
        uVar10 = uVar10 + 1;
        ppcVar11 = ppcVar11 + 2;
      } while (count != uVar10);
    }
  }
  else if (count != 0) {
    psVar3 = sel_vector->sel_vector;
    local_40 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    ppcVar11 = &(result_data->value).pointer.ptr;
    uVar10 = 0;
    do {
      uVar7 = uVar10;
      if (psVar3 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar3[uVar10];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar7 >> 6] >>
           (uVar7 & 0x3f) & 1) == 0) {
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var6 = p_Stack_50;
          peVar5 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar4 = (byte)uVar10 & 0x3f;
        puVar2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar10 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      else {
        sVar12 = StringCastTZ::Operation<duckdb::timestamp_t>
                           ((timestamp_t)ldata[uVar7].value,(Vector *)dataptr);
        uVar8 = sVar12.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
        paVar1->length = (int)uVar8;
        paVar1->prefix[0] = (char)((ulong)uVar8 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar8 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar8 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar8 >> 0x38);
        *ppcVar11 = sVar12.value._8_8_;
      }
      uVar10 = uVar10 + 1;
      ppcVar11 = ppcVar11 + 2;
    } while (count != uVar10);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}